

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void MIR_set_gen_interface(MIR_context_t ctx,MIR_item_t func_item)

{
  gen_ctx *pgVar1;
  VARR_call_ref_t *pVVar2;
  MIR_func_t pMVar3;
  long lVar4;
  void *to;
  MIR_item_t_conflict pMVar5;
  char *pcVar6;
  MIR_item_t_conflict addr_00;
  char *called_func;
  MIR_item_t_conflict pMVar7;
  MIR_item_t_conflict pMVar8;
  uint8_t **ppuVar9;
  size_t sVar10;
  uint8_t *addr;
  int local_44;
  MIR_context_t local_40;
  MIR_item_t_conflict local_38;
  
  if (func_item != (MIR_item_t)0x0) {
    generate_func_code(ctx,func_item,1);
    return;
  }
  pgVar1 = ctx->gen_ctx;
  pVVar2 = pgVar1->target_ctx->call_refs;
  called_func = (char *)0x0;
  if (pVVar2 == (VARR_call_ref_t *)0x0) {
LAB_001546c3:
    MIR_set_gen_interface_cold_2();
    if ((MIR_item_t_conflict)called_func != (MIR_item_t_conflict)0x0) {
      to = _MIR_get_wrapper(ctx,(MIR_item_t_conflict)called_func,
                            generate_func_and_redirect_to_func_code);
      _MIR_redirect_thunk(ctx,((MIR_item_t_conflict)called_func)->addr,to);
      return;
    }
    return;
  }
  sVar10 = pVVar2->els_num;
  if (sVar10 != 0) {
    ppuVar9 = &pVVar2->varr->call_addr;
    local_40 = ctx;
    do {
      pMVar3 = (((call_ref_t *)(ppuVar9 + -1))->ref_func_item->u).func;
      pMVar8 = (MIR_item_t_conflict)pMVar3->machine_code;
      pMVar5 = (MIR_item_t_conflict)*ppuVar9;
      local_44 = *(int *)((long)&pMVar5->data + 2);
      lVar4 = (long)local_44;
      local_38 = pMVar8;
      if (*(uint8_t *)&pMVar5->data == '@') {
        pMVar7 = (MIR_item_t_conflict)((long)&pMVar5->data + lVar4 + 6);
        if ((pMVar7 != pMVar8) &&
           (lVar4 = (long)pMVar8 - (long)((long)&pMVar5->data + 6),
           0xfffffffeffffffff < lVar4 - 0x80000000U)) {
          called_func = (char *)((long)&pMVar5->data + 2);
          local_44 = (int)lVar4;
          ctx = local_40;
          _MIR_change_code(local_40,(uint8_t *)called_func,(uint8_t *)&local_44,4);
          pcVar6 = "32";
          addr_00 = pMVar5;
          pMVar8 = pMVar7;
          goto LAB_001545fa;
        }
        if ((pgVar1->debug_file == (FILE *)0x0) || (pgVar1->debug_level < 2)) goto LAB_0015463f;
        pcVar6 = pMVar3->name;
        called_func = 
        "Failing to make direct 32-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
        ;
LAB_00154668:
        ctx = _stderr;
        fprintf((FILE *)_stderr,called_func,pcVar6,pMVar5,pMVar7,pMVar8);
      }
      else {
        if (*(uint8_t *)&pMVar5->data != 0xff) {
          __assert_fail("call_addr[0] == 0x40",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0xbb6,"void target_change_to_direct_calls(MIR_context_t)");
        }
        pMVar7 = *(MIR_item_t_conflict *)((long)&pMVar5->data + lVar4 + 6);
        if (pMVar8 != pMVar7) {
          addr_00 = (MIR_item_t_conflict)((long)&pMVar5->data + lVar4 + 6);
          called_func = (char *)addr_00;
          ctx = local_40;
          _MIR_change_code(local_40,(uint8_t *)addr_00,(uint8_t *)&local_38,8);
          pcVar6 = "64";
          pMVar8 = pMVar7;
LAB_001545fa:
          if ((pgVar1->debug_file != (FILE *)0x0) && (1 < pgVar1->debug_level)) {
            pMVar5 = (MIR_item_t_conflict)pMVar3->name;
            called_func = 
            "Making direct %s-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n";
            pMVar7 = addr_00;
            goto LAB_00154668;
          }
        }
      }
LAB_0015463f:
      ppuVar9 = ppuVar9 + 2;
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
    pVVar2 = pgVar1->target_ctx->call_refs;
    if ((pVVar2 == (VARR_call_ref_t *)0x0) || (pVVar2->varr == (call_ref_t *)0x0)) {
      MIR_set_gen_interface_cold_1();
      goto LAB_001546c3;
    }
    pVVar2->els_num = 0;
  }
  return;
}

Assistant:

void MIR_set_gen_interface (MIR_context_t ctx, MIR_item_t func_item) {
  if (func_item == NULL) { /* finish setting interfaces */
    target_change_to_direct_calls (ctx);
  } else {
    MIR_gen (ctx, func_item);
  }
}